

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

ByteData *
cfd::core::Psbt::CreateFixRecordKey
          (ByteData *__return_storage_ptr__,uint8_t type,ByteData *fixed_size_key)

{
  ByteData local_30;
  
  ByteData::ByteData(&local_30,type);
  ByteData::Concat<cfd::core::ByteData>(__return_storage_ptr__,&local_30,fixed_size_key);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateFixRecordKey(
    uint8_t type, const ByteData &fixed_size_key) {
  return ByteData(type).Concat(fixed_size_key);
}